

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_close_handle(LIBSSH2_SFTP_HANDLE *hnd)

{
  LIBSSH2_SFTP *pLVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  char *errmsg;
  uchar *puVar8;
  uchar *s;
  size_t data_len;
  uchar *local_68;
  uint local_5c;
  uchar *local_58;
  LIBSSH2_SFTP *local_50;
  size_t local_48;
  char *local_40;
  time_t local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    return -0x27;
  }
  local_38 = time((time_t *)0x0);
  local_40 = hnd->handle;
  do {
    pLVar1 = hnd->sftp;
    channel = pLVar1->channel;
    pLVar2 = channel->session;
    local_48 = 0;
    iVar4 = (int)hnd->handle_len;
    uVar7 = iVar4 + 0xd;
    local_68 = (uchar *)0x0;
    iVar3 = 0;
    local_50 = pLVar1;
    if (hnd->close_state == libssh2_NB_state_idle) {
      pLVar1->last_errno = 0;
      local_5c = uVar7;
      local_58 = (uchar *)(*pLVar2->alloc)((size_t)uVar7,&pLVar2->abstract);
      hnd->close_packet = local_58;
      if (local_58 == (uchar *)0x0) {
        hnd->close_state = libssh2_NB_state_idle;
        iVar3 = _libssh2_error(pLVar2,-6,"Unable to allocate memory for FXP_CLOSE packet");
        uVar7 = local_5c;
      }
      else {
        _libssh2_store_u32(&local_58,iVar4 + 9);
        *local_58 = '\x04';
        uVar5 = pLVar1->request_id;
        pLVar1->request_id = uVar5 + 1;
        hnd->close_request_id = uVar5;
        local_58 = local_58 + 1;
        _libssh2_store_u32(&local_58,uVar5);
        _libssh2_store_str(&local_58,local_40,hnd->handle_len);
        hnd->close_state = libssh2_NB_state_created;
        iVar3 = 0;
        uVar7 = local_5c;
      }
    }
    if (hnd->close_state == libssh2_NB_state_created) {
      uVar6 = _libssh2_channel_write(channel,0,hnd->close_packet,(ulong)uVar7);
      if (uVar6 != 0xffffffffffffffdb) {
        if (uVar6 == uVar7) {
          hnd->close_state = libssh2_NB_state_sent;
        }
        else {
          hnd->close_state = libssh2_NB_state_idle;
          iVar3 = _libssh2_error(pLVar2,-7,"Unable to send FXP_CLOSE command");
        }
        (*pLVar2->free)(hnd->close_packet,&pLVar2->abstract);
        hnd->close_packet = (uchar *)0x0;
      }
      iVar4 = -0x25;
      if (uVar6 != 0xffffffffffffffdb) goto LAB_00126aed;
    }
    else {
LAB_00126aed:
      pLVar1 = local_50;
      iVar4 = iVar3;
      if (hnd->close_state == libssh2_NB_state_sent) {
        iVar4 = sftp_packet_require(local_50,'e',hnd->close_request_id,&local_68,&local_48,9);
        if (iVar4 != 0) {
          if (iVar4 == -0x25) goto LAB_00126c2e;
          if (iVar4 == -0x26) {
            if (local_48 != 0) {
              (*pLVar2->free)(local_68,&pLVar2->abstract);
            }
            local_68 = (uchar *)0x0;
            errmsg = "Packet too short in FXP_CLOSE command";
            iVar3 = -0x1f;
          }
          else {
            errmsg = "Error waiting for status message";
            iVar3 = iVar4;
          }
          _libssh2_error(pLVar2,iVar3,errmsg);
        }
        hnd->close_state = libssh2_NB_state_sent1;
      }
      if (local_68 == (uchar *)0x0) {
        if (iVar4 == 0) {
          __assert_fail("rc",
                        "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                        ,0xaa4,"int sftp_close_handle(LIBSSH2_SFTP_HANDLE *)");
        }
      }
      else {
        uVar5 = _libssh2_ntohu32(local_68 + 5);
        (*pLVar2->free)(local_68,&pLVar2->abstract);
        if (uVar5 != 0) {
          pLVar1->last_errno = uVar5;
          hnd->close_state = libssh2_NB_state_idle;
          iVar4 = _libssh2_error(pLVar2,-0x1f,"SFTP Protocol Error");
        }
      }
      _libssh2_list_remove(&hnd->node);
      if (hnd->handle_type == LIBSSH2_SFTP_HANDLE_FILE) {
        puVar8 = (hnd->u).file.data;
        if (puVar8 != (uchar *)0x0) goto LAB_00126c07;
      }
      else if ((hnd->handle_type == LIBSSH2_SFTP_HANDLE_DIR) && ((hnd->u).dir.names_left != 0)) {
        puVar8 = (uchar *)(hnd->u).dir.names_packet;
LAB_00126c07:
        (*pLVar2->free)(puVar8,&pLVar2->abstract);
      }
      sftp_packetlist_flush(hnd);
      pLVar1->read_state = libssh2_NB_state_idle;
      hnd->close_state = libssh2_NB_state_idle;
      (*pLVar2->free)(hnd,&pLVar2->abstract);
    }
LAB_00126c2e:
    if (iVar4 != -0x25) {
      return iVar4;
    }
    pLVar2 = hnd->sftp->channel->session;
    if (pLVar2 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar2->api_block_mode == 0) {
      return -0x25;
    }
    iVar4 = _libssh2_wait_socket(pLVar2,local_38);
    if (iVar4 != 0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

static int
sftp_close_handle(LIBSSH2_SFTP_HANDLE *handle)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 13);
    unsigned char *s, *data = NULL;
    int rc = 0;

    if(handle->close_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Closing handle"));
        s = handle->close_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!handle->close_packet) {
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for FXP_CLOSE "
                                "packet");
        }
        else {

            _libssh2_store_u32(&s, packet_len - 4);
            *(s++) = SSH_FXP_CLOSE;
            handle->close_request_id = sftp->request_id++;
            _libssh2_store_u32(&s, handle->close_request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            handle->close_state = libssh2_NB_state_created;
        }
    }

    if(handle->close_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, handle->close_packet,
                                          packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((ssize_t)packet_len != nwritten) {
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                "Unable to send FXP_CLOSE command");
        }
        else
            handle->close_state = libssh2_NB_state_sent;

        LIBSSH2_FREE(session, handle->close_packet);
        handle->close_packet = NULL;
    }

    if(handle->close_state == libssh2_NB_state_sent) {
        rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                                 handle->close_request_id, &data,
                                 &data_len, 9);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
            if(data_len > 0) {
                LIBSSH2_FREE(session, data);
            }
            data = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                           "Packet too short in FXP_CLOSE command");
        }
        else if(rc) {
            _libssh2_error(session, rc,
                           "Error waiting for status message");
        }

        handle->close_state = libssh2_NB_state_sent1;
    }

    if(!data) {
        /* if it reaches this point with data unset, something unwanted
           happened for which we should have set an error code */
        assert(rc);

    }
    else {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);

        if(retcode != LIBSSH2_FX_OK) {
            sftp->last_errno = retcode;
            handle->close_state = libssh2_NB_state_idle;
            rc = _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                "SFTP Protocol Error");
        }
    }

    /* remove this handle from the parent's list */
    _libssh2_list_remove(&handle->node);

    if(handle->handle_type == LIBSSH2_SFTP_HANDLE_DIR) {
        if(handle->u.dir.names_left)
            LIBSSH2_FREE(session, handle->u.dir.names_packet);
    }
    else if(handle->handle_type == LIBSSH2_SFTP_HANDLE_FILE) {
        if(handle->u.file.data)
            LIBSSH2_FREE(session, handle->u.file.data);
    }

    sftp_packetlist_flush(handle);
    sftp->read_state = libssh2_NB_state_idle;

    handle->close_state = libssh2_NB_state_idle;

    LIBSSH2_FREE(session, handle);

    return rc;
}